

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O2

uint32_t duckdb::StringStats::MaxStringLength(BaseStatistics *stats)

{
  InternalException *this;
  allocator local_39;
  string local_38;
  
  if (((stats->type).id_ != SQLNULL) &&
     (((stats->stats_union).string_data.has_max_string_length & 1U) != 0)) {
    return (stats->stats_union).string_data.max_string_length;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "MaxStringLength called on statistics that does not have a max string length",&local_39
            );
  InternalException::InternalException(this,&local_38);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool StringStats::HasMaxStringLength(const BaseStatistics &stats) {
	if (stats.GetType().id() == LogicalTypeId::SQLNULL) {
		return false;
	}
	return StringStats::GetDataUnsafe(stats).has_max_string_length;
}